

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  value_type_conflict *__val;
  size_t sVar5;
  ostream *poVar6;
  pointer pdVar7;
  double *pdVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  string *input_stream;
  char *__s;
  int num_bin;
  int output_interval;
  vector<double,_std::allocator<double>_> data;
  double upper_bound;
  double lower_bound;
  vector<double,_std::allocator<double>_> histogram;
  vector<double,_std::allocator<double>_> data_1;
  ostringstream error_message_7;
  Buffer buffer;
  StatisticsAccumulation statistics_accumulation;
  ifstream ifs;
  HistogramCalculation histogram_calculation;
  int local_4f4;
  int local_4f0;
  int local_4ec;
  undefined1 local_4e8 [32];
  double local_4c8;
  double local_4c0;
  double local_4b8;
  vector<double,_std::allocator<double>_> local_4b0;
  vector<double,_std::allocator<double>_> local_498;
  double local_480;
  string local_478 [3];
  ios_base local_408 [264];
  Buffer local_300;
  StatisticsAccumulation local_280;
  string local_268;
  byte abStack_248 [80];
  ios_base local_1f8 [408];
  HistogramCalculation local_60;
  
  local_4ec = -1;
  local_4f0 = 10;
  local_4b8 = 0.0;
  local_4c0 = 1.0;
  local_4c8 = 0.0;
  local_4f4 = 0;
  do {
    iVar4 = ya_getopt_long(argc,argv,"t:b:l:u:nh",(option *)0x0,(int *)0x0);
    if (iVar4 < 0x6c) {
      if (iVar4 == -1) {
        iVar4 = 2;
      }
      else {
        if (iVar4 == 0x62) {
          std::__cxx11::string::string((string *)&local_268,ya_optarg,(allocator *)local_478);
          bVar3 = sptk::ConvertStringToInteger(&local_268,&local_4f0);
          bVar1 = 0 < local_4f0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          if (bVar3 && bVar1) goto LAB_00103a59;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_268,
                     "The argument for the -b option must be a positive integer",0x39);
          local_478[0]._M_dataplus._M_p = (pointer)&local_478[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"histogram","");
          sptk::PrintErrorMessage(local_478,(ostringstream *)&local_268);
          goto LAB_00103ace;
        }
        if (iVar4 != 0x68) goto switchD_001037d0_caseD_6d;
        anon_unknown.dwarf_2dde::PrintUsage((ostream *)&std::cout);
        local_4f4 = 0;
        iVar4 = 1;
      }
    }
    else {
      if (iVar4 - 0x6cU < 10) {
        switch(iVar4) {
        case 0x6c:
          std::__cxx11::string::string((string *)&local_268,ya_optarg,(allocator *)local_478);
          bVar1 = sptk::ConvertStringToDouble(&local_268,&local_4b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          if (bVar1) goto LAB_001039f7;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_268,"The argument for the -l option must be numeric",0x2e);
          local_478[0]._M_dataplus._M_p = (pointer)&local_478[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"histogram","");
          sptk::PrintErrorMessage(local_478,(ostringstream *)&local_268);
          break;
        default:
          goto switchD_001037d0_caseD_6d;
        case 0x6e:
          local_4c8 = (double)CONCAT71((int7)((ulong)((long)&switchD_001037d0::switchdataD_0010d018
                                                     + (long)(int)(&switchD_001037d0::
                                                                    switchdataD_0010d018)
                                                                  [iVar4 - 0x6cU]) >> 8),1);
LAB_001039f7:
          iVar4 = 0;
          goto LAB_00103b09;
        case 0x74:
          std::__cxx11::string::string((string *)&local_268,ya_optarg,(allocator *)local_478);
          bVar3 = sptk::ConvertStringToInteger(&local_268,&local_4ec);
          bVar1 = 0 < local_4ec;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          if (bVar3 && bVar1) {
LAB_00103a59:
            iVar4 = 0;
            goto LAB_00103b09;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_268,
                     "The argument for the -t option must be a positive integer",0x39);
          local_478[0]._M_dataplus._M_p = (pointer)&local_478[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"histogram","");
          sptk::PrintErrorMessage(local_478,(ostringstream *)&local_268);
          break;
        case 0x75:
          std::__cxx11::string::string((string *)&local_268,ya_optarg,(allocator *)local_478);
          bVar1 = sptk::ConvertStringToDouble(&local_268,&local_4c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          if (bVar1) goto LAB_001039f7;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_268,"The argument for the -u option must be numeric",0x2e);
          local_478[0]._M_dataplus._M_p = (pointer)&local_478[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"histogram","");
          sptk::PrintErrorMessage(local_478,(ostringstream *)&local_268);
        }
LAB_00103ace:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478[0]._M_dataplus._M_p != &local_478[0].field_2) {
          operator_delete(local_478[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_268);
        std::ios_base::~ios_base(local_1f8);
      }
      else {
switchD_001037d0_caseD_6d:
        anon_unknown.dwarf_2dde::PrintUsage((ostream *)&std::cerr);
      }
      iVar4 = 1;
      local_4f4 = 1;
    }
LAB_00103b09:
    paVar9 = &local_478[0].field_2;
  } while (iVar4 == 0);
  if (iVar4 != 2) {
    return local_4f4;
  }
  if (local_4c0 <= local_4b8) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_268,"Upper bound must be greater than lower bound",0x2c);
    local_478[0]._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"histogram","");
    sptk::PrintErrorMessage(local_478,(ostringstream *)&local_268);
LAB_00103bef:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478[0]._M_dataplus._M_p != paVar9) {
      operator_delete(local_478[0]._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_268);
    std::ios_base::~ios_base(local_1f8);
    return 1;
  }
  if (1 < argc - ya_optind) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_268,"Too many input files",0x14);
    local_478[0]._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"histogram","");
    sptk::PrintErrorMessage(local_478,(ostringstream *)&local_268);
    goto LAB_00103bef;
  }
  if (argc == ya_optind) {
    __s = (char *)0x0;
  }
  else {
    __s = argv[ya_optind];
  }
  bVar1 = sptk::SetBinaryMode();
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_268,"Cannot set translation mode",0x1b);
    local_478[0]._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"histogram","");
    sptk::PrintErrorMessage(local_478,(ostringstream *)&local_268);
    goto LAB_00103bef;
  }
  input_stream = &local_268;
  std::ifstream::ifstream(input_stream);
  if ((__s == (char *)0x0) ||
     (std::ifstream::open((char *)&local_268,(_Ios_Openmode)__s),
     (abStack_248[*(long *)(local_268._M_dataplus._M_p + -0x18)] & 5) == 0)) {
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      input_stream = (string *)&std::cin;
    }
    sptk::HistogramCalculation::HistogramCalculation(&local_60,local_4f0,local_4b8,local_4c0);
    if (local_60.is_valid_ != false) {
      std::vector<double,_std::allocator<double>_>::vector
                (&local_4b0,(long)local_4f0,(allocator_type *)local_478);
      if ((long)local_4ec == 0xffffffffffffffff) {
        local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)operator_new(8);
        local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
        *local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start = 0.0;
        local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        sptk::StatisticsAccumulation::StatisticsAccumulation
                  (&local_280,local_4f0 + -1,1,false,false);
        sptk::StatisticsAccumulation::Buffer::Buffer(&local_300);
LAB_0010414b:
        bVar1 = sptk::ReadStream<double>(false,0,0,1,&local_498,(istream *)input_stream,(int *)0x0);
        if (bVar1) {
          bVar1 = sptk::HistogramCalculation::Run(&local_60,&local_498,&local_4b0);
          if (bVar1) goto code_r0x00104187;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_478,"Failed to calculate histogram",0x1d);
          local_4e8._0_8_ = local_4e8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"histogram","");
          sptk::PrintErrorMessage((string *)local_4e8,(ostringstream *)local_478);
        }
        else {
          bVar1 = sptk::StatisticsAccumulation::GetSum(&local_280,&local_300,&local_4b0);
          if (bVar1) {
            if (((ulong)local_4c8 & 1) != 0) {
              local_4c8 = 0.0;
              for (pdVar8 = local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pdVar8 != local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish; pdVar8 = pdVar8 + 1) {
                local_4c8 = local_4c8 + *pdVar8;
              }
              if ((local_4c8 != 0.0) || (NAN(local_4c8))) {
                if (local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  pdVar7 = local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  do {
                    *pdVar7 = *pdVar7 * (1.0 / local_4c8);
                    pdVar7 = pdVar7 + 1;
                  } while (pdVar7 != local_4b0.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_finish);
                }
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_478,"Failed to calculate normalized histogram",0x28);
                local_4e8._0_8_ = local_4e8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"histogram","");
                sptk::PrintErrorMessage((string *)local_4e8,(ostringstream *)local_478);
                if ((undefined1 *)local_4e8._0_8_ != local_4e8 + 0x10) {
                  operator_delete((void *)local_4e8._0_8_);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_478);
                std::ios_base::~ios_base(local_408);
                local_4f4 = 1;
              }
              if ((local_4c8 == 0.0) && (!NAN(local_4c8))) goto LAB_00104598;
            }
            bVar3 = sptk::WriteStream<double>
                              (0,local_4f0,&local_4b0,(ostream *)&std::cout,(int *)0x0);
            bVar1 = true;
            if (!bVar3) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_478,"Failed to write histogram",0x19);
              local_4e8._0_8_ = local_4e8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"histogram","");
              sptk::PrintErrorMessage((string *)local_4e8,(ostringstream *)local_478);
              goto LAB_00104560;
            }
            goto LAB_0010459a;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_478,"Failed to get histogram",0x17);
          local_4e8._0_8_ = local_4e8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"histogram","");
          sptk::PrintErrorMessage((string *)local_4e8,(ostringstream *)local_478);
        }
        goto LAB_00104560;
      }
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_4e8,(long)local_4ec,
                 (allocator_type *)local_478);
      iVar4 = 0;
      do {
        bVar1 = sptk::ReadStream<double>
                          (false,0,0,local_4ec,(vector<double,_std::allocator<double>_> *)local_4e8,
                           (istream *)input_stream,(int *)0x0);
        if (!bVar1) goto LAB_0010429b;
        bVar3 = sptk::HistogramCalculation::Run
                          (&local_60,(vector<double,_std::allocator<double>_> *)local_4e8,&local_4b0
                          );
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_478,"Failed to calculate histogram",0x1d);
          local_300._vptr_Buffer = (_func_int **)&local_300.first_order_statistics_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"histogram","");
          sptk::PrintErrorMessage((string *)&local_300,(ostringstream *)local_478);
          goto LAB_00104258;
        }
        if (((ulong)local_4c8 & 1) != 0) {
          local_480 = 0.0;
          for (pdVar8 = local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar8 != local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish; pdVar8 = pdVar8 + 1) {
            local_480 = local_480 + *pdVar8;
          }
          if ((local_480 != 0.0) || (NAN(local_480))) {
            if (local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              pdVar7 = local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              do {
                *pdVar7 = *pdVar7 * (1.0 / local_480);
                pdVar7 = pdVar7 + 1;
              } while (pdVar7 != local_4b0.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish);
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_478,"Failed to calculate normalized histogram at ",0x2c);
            poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_478,iVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"th frame",8);
            local_300._vptr_Buffer = (_func_int **)&local_300.first_order_statistics_;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"histogram","");
            sptk::PrintErrorMessage((string *)&local_300,(ostringstream *)local_478);
            if ((vector<double,_std::allocator<double>_> *)local_300._vptr_Buffer !=
                &local_300.first_order_statistics_) {
              operator_delete(local_300._vptr_Buffer);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_478);
            std::ios_base::~ios_base(local_408);
            local_4f4 = 1;
          }
          if ((local_480 == 0.0) && (!NAN(local_480))) goto LAB_0010429b;
        }
        bVar3 = sptk::WriteStream<double>(0,local_4f0,&local_4b0,(ostream *)&std::cout,(int *)0x0);
        iVar4 = iVar4 + 1;
      } while (bVar3);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_478,"Failed to write histogram",0x19);
      local_300._vptr_Buffer = (_func_int **)&local_300.first_order_statistics_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"histogram","");
      sptk::PrintErrorMessage((string *)&local_300,(ostringstream *)local_478);
LAB_00104258:
      if ((vector<double,_std::allocator<double>_> *)local_300._vptr_Buffer !=
          &local_300.first_order_statistics_) {
        operator_delete(local_300._vptr_Buffer);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_478);
      std::ios_base::~ios_base(local_408);
      local_4f4 = 1;
LAB_0010429b:
      if ((pointer)local_4e8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_4e8._0_8_);
      }
      if (!bVar1) goto LAB_001042af;
      goto LAB_001042b7;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_478,"Failed to initialize HistogramCalculation",0x29);
    local_300._vptr_Buffer = (_func_int **)&local_300.first_order_statistics_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"histogram","");
    sptk::PrintErrorMessage((string *)&local_300,(ostringstream *)local_478);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_478,"Cannot open file ",0x11);
    sVar5 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_478,__s,sVar5);
    local_300._vptr_Buffer = (_func_int **)&local_300.first_order_statistics_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"histogram","");
    sptk::PrintErrorMessage((string *)&local_300,(ostringstream *)local_478);
  }
  if ((vector<double,_std::allocator<double>_> *)local_300._vptr_Buffer !=
      &local_300.first_order_statistics_) {
    operator_delete(local_300._vptr_Buffer);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_478);
  std::ios_base::~ios_base(local_408);
  local_4f4 = 1;
  goto LAB_001042c6;
code_r0x00104187:
  bVar1 = sptk::StatisticsAccumulation::Run(&local_280,&local_4b0,&local_300);
  if (!bVar1) goto LAB_00104199;
  goto LAB_0010414b;
LAB_00104199:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_478,"Failed to accumulate histogram",0x1e);
  local_4e8._0_8_ = local_4e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"histogram","");
  sptk::PrintErrorMessage((string *)local_4e8,(ostringstream *)local_478);
LAB_00104560:
  if ((undefined1 *)local_4e8._0_8_ != local_4e8 + 0x10) {
    operator_delete((void *)local_4e8._0_8_);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_478);
  std::ios_base::~ios_base(local_408);
  local_4f4 = 1;
LAB_00104598:
  bVar1 = false;
LAB_0010459a:
  sptk::StatisticsAccumulation::Buffer::~Buffer(&local_300);
  if (local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (bVar1) {
LAB_001042af:
    local_4f4 = 0;
  }
LAB_001042b7:
  if (local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_001042c6:
  std::ifstream::~ifstream(&local_268);
  return local_4f4;
}

Assistant:

int main(int argc, char* argv[]) {
  int output_interval(kMagicNumberForEndOfFile);
  int num_bin(kDefaultNumBin);
  double lower_bound(kDefaultLowerBound);
  double upper_bound(kDefaultUpperBound);
  bool normalization_flag(kDefaultNormalizationFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "t:b:l:u:nh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 't': {
        if (!sptk::ConvertStringToInteger(optarg, &output_interval) ||
            output_interval <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -t option must be a positive integer";
          sptk::PrintErrorMessage("histogram", error_message);
          return 1;
        }
        break;
      }
      case 'b': {
        if (!sptk::ConvertStringToInteger(optarg, &num_bin) || num_bin <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -b option must be a positive integer";
          sptk::PrintErrorMessage("histogram", error_message);
          return 1;
        }
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToDouble(optarg, &lower_bound)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be numeric";
          sptk::PrintErrorMessage("histogram", error_message);
          return 1;
        }
        break;
      }
      case 'u': {
        if (!sptk::ConvertStringToDouble(optarg, &upper_bound)) {
          std::ostringstream error_message;
          error_message << "The argument for the -u option must be numeric";
          sptk::PrintErrorMessage("histogram", error_message);
          return 1;
        }
        break;
      }
      case 'n': {
        normalization_flag = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (upper_bound <= lower_bound) {
    std::ostringstream error_message;
    error_message << "Upper bound must be greater than lower bound";
    sptk::PrintErrorMessage("histogram", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("histogram", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("histogram", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("histogram", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::HistogramCalculation histogram_calculation(num_bin, lower_bound,
                                                   upper_bound);
  if (!histogram_calculation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize HistogramCalculation";
    sptk::PrintErrorMessage("histogram", error_message);
    return 1;
  }

  std::vector<double> histogram(num_bin);

  if (kMagicNumberForEndOfFile == output_interval) {
    std::vector<double> data(1);
    sptk::StatisticsAccumulation statistics_accumulation(num_bin - 1, 1);
    sptk::StatisticsAccumulation::Buffer buffer;
    while (sptk::ReadStream(false, 0, 0, 1, &data, &input_stream, NULL)) {
      if (!histogram_calculation.Run(data, &histogram)) {
        std::ostringstream error_message;
        error_message << "Failed to calculate histogram";
        sptk::PrintErrorMessage("histogram", error_message);
        return 1;
      }
      if (!statistics_accumulation.Run(histogram, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to accumulate histogram";
        sptk::PrintErrorMessage("histogram", error_message);
        return 1;
      }
    }

    if (!statistics_accumulation.GetSum(buffer, &histogram)) {
      std::ostringstream error_message;
      error_message << "Failed to get histogram";
      sptk::PrintErrorMessage("histogram", error_message);
      return 1;
    }

    if (normalization_flag) {
      const double sum(
          std::accumulate(histogram.begin(), histogram.end(), 0.0));
      if (0.0 == sum) {
        std::ostringstream error_message;
        error_message << "Failed to calculate normalized histogram";
        sptk::PrintErrorMessage("histogram", error_message);
        return 1;
      }
      const double z(1.0 / sum);
      std::transform(histogram.begin(), histogram.end(), histogram.begin(),
                     [z](double x) { return x * z; });
    }

    if (!sptk::WriteStream(0, num_bin, histogram, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write histogram";
      sptk::PrintErrorMessage("histogram", error_message);
      return 1;
    }
  } else {
    std::vector<double> data(output_interval);
    for (int frame_index(0); sptk::ReadStream(false, 0, 0, output_interval,
                                              &data, &input_stream, NULL);
         ++frame_index) {
      if (!histogram_calculation.Run(data, &histogram)) {
        std::ostringstream error_message;
        error_message << "Failed to calculate histogram";
        sptk::PrintErrorMessage("histogram", error_message);
        return 1;
      }

      if (normalization_flag) {
        const double sum(
            std::accumulate(histogram.begin(), histogram.end(), 0.0));
        if (0.0 == sum) {
          std::ostringstream error_message;
          error_message << "Failed to calculate normalized histogram at "
                        << frame_index << "th frame";
          sptk::PrintErrorMessage("histogram", error_message);
          return 1;
        }
        const double z(1.0 / sum);
        std::transform(histogram.begin(), histogram.end(), histogram.begin(),
                       [z](double x) { return x * z; });
      }

      if (!sptk::WriteStream(0, num_bin, histogram, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write histogram";
        sptk::PrintErrorMessage("histogram", error_message);
        return 1;
      }
    }
  }

  return 0;
}